

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
randomx::VmBase<randomx::AlignedAllocator<64UL>,_true>::~VmBase
          (VmBase<randomx::AlignedAllocator<64UL>,_true> *this)

{
  code *pcVar1;
  VmBase<randomx::AlignedAllocator<64UL>,_true> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}